

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

void absl::anon_unknown_0::EncodeResult<double>
               (CalculatedFloat *calculated,bool negative,Nonnull<absl::from_chars_result_*> result,
               Nonnull<double_*> value)

{
  byte bVar1;
  double *in_RCX;
  long in_RDX;
  byte in_SIL;
  long *in_RDI;
  double dVar2;
  double dVar3;
  undefined8 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  double local_28;
  
  bVar1 = in_SIL & 1;
  if ((int)in_RDI[1] == 99999) {
    *(undefined4 *)(in_RDX + 8) = 0x22;
    dVar2 = std::numeric_limits<double>::max();
    dVar3 = std::numeric_limits<double>::max();
    local_28 = -dVar2;
    if ((bVar1 & 1) == 0) {
      local_28 = dVar3;
    }
    *in_RCX = local_28;
  }
  else if ((*in_RDI == 0) || ((int)in_RDI[1] == -99999)) {
    *(undefined4 *)(in_RDX + 8) = 0x22;
    dVar2 = -0.0;
    if (bVar1 == 0) {
      dVar2 = 0.0;
    }
    *in_RCX = dVar2;
  }
  else {
    dVar2 = FloatTraits<double>::Make
                      (CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                       (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                       SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x18,0));
    *in_RCX = dVar2;
  }
  return;
}

Assistant:

void EncodeResult(const CalculatedFloat& calculated, bool negative,
                  absl::Nonnull<absl::from_chars_result*> result,
                  absl::Nonnull<FloatType*> value) {
  if (calculated.exponent == kOverflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -std::numeric_limits<FloatType>::max()
                      : std::numeric_limits<FloatType>::max();
    return;
  } else if (calculated.mantissa == 0 || calculated.exponent == kUnderflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -0.0 : 0.0;
    return;
  }
  *value = FloatTraits<FloatType>::Make(
      static_cast<typename FloatTraits<FloatType>::mantissa_t>(
          calculated.mantissa),
      calculated.exponent, negative);
}